

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O1

int arena_i_extent_hooks_ctl
              (tsd_t *tsd,size_t *mib,size_t miblen,void *oldp,size_t *oldlenp,void *newp,
              size_t newlen)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  arena_t *paVar5;
  ehooks_t *peVar6;
  uint ind;
  size_t sVar7;
  bool bVar8;
  arena_config_t config;
  extent_hooks_t *local_50;
  arena_config_t local_48;
  
  iVar3 = pthread_mutex_trylock((pthread_mutex_t *)((long)&ctl_mtx.field_0 + 0x48));
  if (iVar3 != 0) {
    duckdb_je_malloc_mutex_lock_slow(&ctl_mtx);
    ctl_mtx.field_0.field_0.locked.repr = (atomic_b_t)true;
  }
  ctl_mtx.field_0.field_0.prof_data.n_lock_ops = ctl_mtx.field_0.field_0.prof_data.n_lock_ops + 1;
  if (&(ctl_mtx.field_0.field_0.prof_data.prev_owner)->tsd != tsd) {
    ctl_mtx.field_0.witness.link.qre_prev =
         (witness_t *)(ctl_mtx.field_0.field_0.prof_data.n_owner_switches + 1);
    ctl_mtx.field_0.field_0.prof_data.prev_owner = (tsdn_t *)tsd;
  }
  uVar1 = mib[1];
  iVar3 = 0xe;
  if (uVar1 >> 0x20 != 0) goto LAB_01184eed;
  uVar4 = duckdb_je_narenas_total_get();
  ind = (uint)uVar1;
  if (uVar4 <= ind) goto LAB_01184eed;
  paVar5 = (arena_t *)duckdb_je_arenas[uVar1].repr;
  if (paVar5 == (arena_t *)0x0) {
    paVar5 = (arena_t *)0x0;
  }
  if (paVar5 == (arena_t *)0x0) {
    iVar3 = 0xe;
    bVar8 = true;
    if (ind < duckdb_je_narenas_auto) {
      local_50 = &duckdb_je_ehooks_default_extent_hooks;
      if (oldlenp != (size_t *)0x0 && oldp != (void *)0x0) {
        uVar1 = *oldlenp;
        if (uVar1 != 8) {
          sVar7 = 8;
          if (uVar1 < 8) {
            sVar7 = uVar1;
          }
          switchD_00b1522a::default(oldp,&local_50,sVar7);
          bVar8 = true;
          *oldlenp = sVar7;
          iVar3 = 0x16;
          goto LAB_01184ee2;
        }
        *(extent_hooks_t **)oldp = &duckdb_je_ehooks_default_extent_hooks;
      }
      if (newp == (void *)0x0) goto LAB_01184e88;
      if (newlen == 8) {
        local_48.extent_hooks = *newp;
        local_48.metadata_use_hooks = true;
        local_48._9_7_ = 0;
        paVar5 = duckdb_je_arena_init((tsdn_t *)tsd,ind,&local_48);
        bVar8 = paVar5 == (arena_t *)0x0;
        iVar3 = 0xe;
      }
      else {
        iVar3 = 0x16;
        bVar8 = true;
      }
      if (!bVar8) goto LAB_01184ee0;
    }
  }
  else {
    if (newp == (void *)0x0) {
      peVar6 = duckdb_je_arena_get_ehooks(paVar5);
      local_50 = (extent_hooks_t *)(peVar6->ptr).repr;
      if (oldlenp != (size_t *)0x0 && oldp != (void *)0x0) {
        uVar1 = *oldlenp;
        if (uVar1 != 8) {
          sVar7 = 8;
          if (uVar1 < 8) {
            sVar7 = uVar1;
          }
          switchD_00b1522a::default(oldp,&local_50,sVar7);
          *oldlenp = sVar7;
          iVar3 = 0x16;
          bVar8 = true;
          goto LAB_01184ee2;
        }
        *(extent_hooks_t **)oldp = local_50;
LAB_01184e88:
        iVar3 = 0xe;
      }
    }
    else {
      bVar8 = true;
      bVar2 = false;
      if (newlen == 8) {
        local_50 = duckdb_je_arena_set_extent_hooks(tsd,paVar5,*newp);
        bVar2 = true;
        if (oldlenp != (size_t *)0x0 && oldp != (void *)0x0) {
          uVar1 = *oldlenp;
          if (uVar1 != 8) {
            sVar7 = 8;
            if (uVar1 < 8) {
              sVar7 = uVar1;
            }
            switchD_00b1522a::default(oldp,&local_50,sVar7);
            *oldlenp = sVar7;
            bVar2 = false;
            bVar8 = true;
            goto LAB_01184ed7;
          }
          *(extent_hooks_t **)oldp = local_50;
        }
        bVar8 = false;
      }
LAB_01184ed7:
      iVar3 = 0x16;
      if (!bVar2) goto LAB_01184ee2;
    }
LAB_01184ee0:
    bVar8 = false;
  }
LAB_01184ee2:
  if (!bVar8) {
    if (bVar8) {
      return iVar3;
    }
    iVar3 = 0;
  }
LAB_01184eed:
  ctl_mtx.field_0.field_0.locked.repr = (atomic_b_t)false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&ctl_mtx.field_0 + 0x48));
  return iVar3;
}

Assistant:

static int
arena_i_extent_hooks_ctl(tsd_t *tsd, const size_t *mib, size_t miblen,
    void *oldp, size_t *oldlenp, void *newp, size_t newlen) {
	int ret;
	unsigned arena_ind;
	arena_t *arena;

	malloc_mutex_lock(tsd_tsdn(tsd), &ctl_mtx);
	MIB_UNSIGNED(arena_ind, 1);
	if (arena_ind < narenas_total_get()) {
		extent_hooks_t *old_extent_hooks;
		arena = arena_get(tsd_tsdn(tsd), arena_ind, false);
		if (arena == NULL) {
			if (arena_ind >= narenas_auto) {
				ret = EFAULT;
				goto label_return;
			}
			old_extent_hooks =
			    (extent_hooks_t *)&ehooks_default_extent_hooks;
			READ(old_extent_hooks, extent_hooks_t *);
			if (newp != NULL) {
				/* Initialize a new arena as a side effect. */
				extent_hooks_t *new_extent_hooks
				    JEMALLOC_CC_SILENCE_INIT(NULL);
				WRITE(new_extent_hooks, extent_hooks_t *);
				arena_config_t config = arena_config_default;
				config.extent_hooks = new_extent_hooks;

				arena = arena_init(tsd_tsdn(tsd), arena_ind,
				    &config);
				if (arena == NULL) {
					ret = EFAULT;
					goto label_return;
				}
			}
		} else {
			if (newp != NULL) {
				extent_hooks_t *new_extent_hooks
				    JEMALLOC_CC_SILENCE_INIT(NULL);
				WRITE(new_extent_hooks, extent_hooks_t *);
				old_extent_hooks = arena_set_extent_hooks(tsd,
				    arena, new_extent_hooks);
				READ(old_extent_hooks, extent_hooks_t *);
			} else {
				old_extent_hooks =
				    ehooks_get_extent_hooks_ptr(
					arena_get_ehooks(arena));
				READ(old_extent_hooks, extent_hooks_t *);
			}
		}
	} else {
		ret = EFAULT;
		goto label_return;
	}
	ret = 0;
label_return:
	malloc_mutex_unlock(tsd_tsdn(tsd), &ctl_mtx);
	return ret;
}